

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parsePrimitiveDataType
                 (char *in,char *end,ValueType *type,size_t *len)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  char *__nptr;
  char *start;
  bool ok;
  size_t sStack_38;
  uint i;
  size_t prim_len;
  size_t *len_local;
  ValueType *type_local;
  char *end_local;
  char *in_local;
  
  *type = ddl_none;
  *len = 0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    sStack_38 = 0;
    for (start._4_4_ = ddl_bool; (uint)start._4_4_ < 0xe; start._4_4_ = start._4_4_ + ddl_int8) {
      sStack_38 = strlen(*(char **)(Grammar::PrimitiveTypeToken + (ulong)(uint)start._4_4_ * 8));
      iVar3 = strncmp(in,*(char **)(Grammar::PrimitiveTypeToken + (ulong)(uint)start._4_4_ * 8),
                      sStack_38);
      if (iVar3 == 0) {
        *type = start._4_4_;
        break;
      }
    }
    if (*type == ddl_none) {
      in_local = lookForNextToken<char>(in,end);
    }
    else {
      end_local = in + sStack_38;
      bVar1 = true;
      if (*end_local == *Grammar::OpenArrayToken) {
        bVar1 = false;
        __nptr = end_local + 1;
        pcVar2 = __nptr;
        do {
          end_local = pcVar2;
          if (end_local == end) goto LAB_00bb8e3e;
          pcVar2 = end_local + 1;
        } while (end_local[1] != *Grammar::CloseArrayToken);
        iVar3 = atoi(__nptr);
        *len = (long)iVar3;
        bVar1 = true;
        end_local = end_local + 2;
      }
      else {
        *len = 1;
      }
LAB_00bb8e3e:
      if (!bVar1) {
        *type = ddl_none;
      }
      in_local = end_local;
    }
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parsePrimitiveDataType( char *in, char *end, Value::ValueType &type, size_t &len ) {
    type = Value::ddl_none;
    len = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    size_t prim_len( 0 );
    for( unsigned int i = 0; i < Value::ddl_types_max; i++ ) {
        prim_len = strlen( Grammar::PrimitiveTypeToken[ i ] );
        if( 0 == strncmp( in, Grammar::PrimitiveTypeToken[ i ], prim_len ) ) {
            type = static_cast<Value::ValueType>( i );
            break;
        }
    }

    if( Value::ddl_none == type ) {
        in = lookForNextToken( in, end );
        return in;
    } else {
        in += prim_len;
    }

    bool ok( true );
    if( *in == Grammar::OpenArrayToken[ 0 ] ) {
        ok = false;
        ++in;
        char *start( in );
        while ( in != end ) {
            ++in;
            if( *in == Grammar::CloseArrayToken[ 0 ] ) {
                len = ::atoi( start );
                ok = true;
                ++in;
                break;
            }
        }
    } else {
        len = 1;
    }
    if( !ok ) {
        type = Value::ddl_none;
    }

    return in;
}